

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher.cpp
# Opt level: O3

void __thiscall FileSystemWatcher::processChanges(FileSystemWatcher *this,uint types)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_> *this_00;
  _Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_> *p_Var2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  Set<Path> p;
  anon_struct_24_3_203d5c27 signals [3];
  _Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_> local_d8;
  _Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_> local_a8;
  uint local_78 [2];
  Signal<std::function<void_(const_Path_&)>_> *local_70;
  Set<Path> *local_68;
  undefined4 local_60;
  Signal<std::function<void_(const_Path_&)>_> *local_58;
  Set<Path> *local_50;
  undefined4 local_48;
  Signal<std::function<void_(const_Path_&)>_> *local_40;
  Set<Path> *local_38;
  
  if (types == 0) {
    __assert_fail("types",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher.cpp"
                  ,0x22,"void FileSystemWatcher::processChanges(unsigned int)");
  }
  local_78[0] = 1;
  local_70 = &this->mAdded;
  local_68 = &this->mAddedPaths;
  local_60 = 2;
  local_58 = &this->mRemoved;
  local_50 = &this->mRemovedPaths;
  local_48 = 4;
  local_40 = &this->mModified;
  local_38 = &this->mModifiedPaths;
  p_Var1 = &local_d8._M_impl.super__Rb_tree_header;
  lVar6 = 0;
  do {
    if ((local_78[lVar6 * 6] & types) != 0) {
      local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      if (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Var4 = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        p_Var2 = &local_a8;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      else {
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count =
             local_d8._M_impl.super__Rb_tree_header._M_node_count;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var2 = &local_d8;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_right;
        _Var4 = local_d8._M_impl.super__Rb_tree_header._M_header._M_color;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      this_00 = (_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>
                 *)(&local_68)[lVar6 * 3];
      (p_Var2->_M_impl).super__Rb_tree_header._M_node_count = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _Var4;
      std::set<Path,_std::less<Path>,_std::allocator<Path>_>::operator=
                ((set<Path,_std::less<Path>,_std::allocator<Path>_> *)&local_d8,
                 (set<Path,_std::less<Path>,_std::allocator<Path>_> *)this_00);
      std::_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>::clear
                (this_00);
      if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_color =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_left =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_00->_M_impl).super__Rb_tree_header._M_header;
        (this_00->_M_impl).super__Rb_tree_header._M_node_count =
             local_a8._M_impl.super__Rb_tree_header._M_node_count;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      std::_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>::
      ~_Rb_tree(&local_a8);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
      for (p_Var5 = local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != p_Var1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        Signal<std::function<void(Path_const&)>>::operator()
                  ((Signal<std::function<void(Path_const&)>> *)(&local_70)[lVar6 * 3],
                   (Path *)(p_Var5 + 1));
      }
      std::_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>::
      ~_Rb_tree(&local_d8);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void FileSystemWatcher::processChanges(unsigned int types)
{
    assert(types);
    struct {
        const Type type;
        Signal<std::function<void(const Path&)> > &signal;
        Set<Path> &paths;
    } signals[] = {
        { Add, mAdded, mAddedPaths },
        { Remove, mRemoved, mRemovedPaths },
        { Modified, mModified, mModifiedPaths }
    };

    const unsigned int count = sizeof(signals) / sizeof(signals[0]);
    for (unsigned i=0; i<count; ++i) {
        if (types & signals[i].type) {
            Set<Path> p;
            {
                std::lock_guard<std::mutex> lock(mMutex);
                std::swap(p, signals[i].paths);
            }

            for (Set<Path>::const_iterator it = p.begin(); it != p.end(); ++it) {
                signals[i].signal(*it);
            }
        }
    }
}